

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

uint32 __thiscall crnd::symbol_codec::get_bits(symbol_codec *this,uint32 num_bits)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  bit_buf_type bVar4;
  uint uVar5;
  
  iVar2 = this->m_bit_count;
  if (iVar2 < (int)num_bits) {
    pbVar3 = this->m_pDecode_buf_next;
    bVar4 = this->m_bit_buf;
    iVar1 = 0x18 - iVar2;
    do {
      if (pbVar3 == this->m_pDecode_buf_end) {
        uVar5 = 0;
      }
      else {
        this->m_pDecode_buf_next = pbVar3 + 1;
        uVar5 = (uint)*pbVar3;
        pbVar3 = pbVar3 + 1;
      }
      iVar2 = iVar2 + 8;
      this->m_bit_count = iVar2;
      bVar4 = bVar4 | uVar5 << ((byte)iVar1 & 0x1f);
      this->m_bit_buf = bVar4;
      iVar1 = iVar1 + -8;
    } while (iVar2 < (int)num_bits);
  }
  uVar5 = this->m_bit_buf;
  this->m_bit_buf = uVar5 << ((byte)num_bits & 0x1f);
  this->m_bit_count = iVar2 - num_bits;
  return uVar5 >> (-(byte)num_bits & 0x1f);
}

Assistant:

uint32 symbol_codec::get_bits(uint32 num_bits)
    {
        CRND_ASSERT(num_bits <= 32U);

        while (m_bit_count < (int)num_bits)
        {
            bit_buf_type c = 0;
            if (m_pDecode_buf_next != m_pDecode_buf_end)
                c = *m_pDecode_buf_next++;

            m_bit_count += 8;
            CRND_ASSERT(m_bit_count <= cBitBufSize);

            m_bit_buf |= (c << (cBitBufSize - m_bit_count));
        }

        uint32 result = static_cast<uint32>(m_bit_buf >> (cBitBufSize - num_bits));

        m_bit_buf <<= num_bits;
        m_bit_count -= num_bits;

        return result;
    }